

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O0

void aom_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  __m128i shift_00;
  __m128i shift_01;
  __m128i shift_02;
  __m128i shift_03;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int16_t *in_RCX;
  int *piVar26;
  int16_t *in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  tran_low_t *coeff_ptr_00;
  longlong extraout_RDX_02;
  tran_low_t *coeff_ptr_01;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  tran_low_t *coeff_ptr_02;
  longlong extraout_RDX_06;
  tran_low_t *coeff_ptr_03;
  long in_RSI;
  __m128i *cmp_mask1_00;
  tran_low_t *in_RDI;
  tran_low_t *ptVar27;
  int16_t *in_R8;
  int16_t *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  short sVar39;
  short sVar40;
  short sVar42;
  short sVar43;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar44;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i coeff_vals;
  __m128i coeff_vals_00;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i coeff_vals_01;
  __m128i coeff_vals_02;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i coeff_vals_03;
  __m128i coeff_vals_04;
  __m128i qcoeff_02;
  __m128i qcoeff_03;
  __m128i coeff_vals_05;
  __m128i coeff_vals_06;
  __m128i mask;
  __m128i mask_00;
  __m128i sign;
  __m128i sign_00;
  __m128i sign_01;
  __m128i sign_02;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i sign_03;
  __m128i sign_04;
  __m128i sign_05;
  __m128i sign_06;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i quant_00;
  __m128i quant_01;
  __m128i quant_02;
  __m128i quant_03;
  __m128i round_00;
  __m128i round_01;
  __m128i round_02;
  __m128i round_03;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  int16_t *in_stack_00000018;
  ushort *in_stack_00000020;
  int prescan_add_val;
  int factor;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc_3;
  int qcoeff;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  int first;
  __m128i threshold [2];
  int i;
  qm_val_t wt;
  int thresh [4];
  int prescan_add [2];
  __m128i mask1;
  __m128i mask0;
  __m128i all_zero;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1_sign;
  __m128i coeff0_sign;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  __m128i zero;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int index;
  int16_t *piVar45;
  __m128i *dequant_04;
  int local_710;
  int local_708;
  int local_700;
  int local_6fc;
  int iVar46;
  undefined3 in_stack_fffffffffffff934;
  undefined4 uVar47;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  undefined4 uVar48;
  undefined4 uVar49;
  __m128i *in_stack_fffffffffffff948;
  __m128i *in_stack_fffffffffffff950;
  __m128i *qcoeff0_00;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_668;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short sStack_660;
  short sStack_65e;
  short sStack_65c;
  short sStack_65a;
  __m128i local_658;
  ulong local_648;
  ulong uStack_640;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined8 local_608;
  undefined8 uStack_600;
  longlong local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined8 uStack_5e0;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined4 local_590;
  int local_58c;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  int16_t *local_560;
  long local_558;
  tran_low_t *local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined1 *local_530;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 uStack_50c;
  longlong local_508;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4ec;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4cc;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_48c;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_46c;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined4 uStack_44c;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 uStack_42c;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 local_3dc;
  undefined4 local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined4 local_39c;
  undefined4 local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  longlong lStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  longlong lStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_88;
  ulong uStack_80;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  undefined8 uVar41;
  
  local_57c = 0x10;
  local_580 = 0;
  local_584 = 0;
  local_588 = 0;
  local_58c = 0;
  local_590 = 0xffffffff;
  local_548 = 0;
  uStack_540 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  qcoeff0_00 = (__m128i *)0x0;
  uVar47 = CONCAT13(0x20,in_stack_fffffffffffff934);
  for (iVar46 = 0; iVar46 < 2; iVar46 = iVar46 + 1) {
    *(int *)(&stack0xfffffffffffff950 + (long)iVar46 * 4) =
         in_stack_00000018[iVar46] * 0x145 + 0x40 >> 7;
    *(int *)(&stack0xfffffffffffff938 + (long)iVar46 * 4) =
         in_RDX[iVar46] * 0x20 + *(int *)(&stack0xfffffffffffff950 + (long)iVar46 * 4) + -1;
  }
  local_530 = &stack0xfffffffffffff938;
  local_6fc = -1;
  dequant_04 = (__m128i *)&local_5e8;
  coeff_vals_02[0] = (__m128i *)&local_5b8;
  coeff_vals_06[0] = (__m128i *)&local_5c8;
  piVar45 = in_stack_00000018;
  uVar48 = in_stack_fffffffffffff93c;
  uVar49 = in_stack_fffffffffffff93c;
  local_560 = in_RDX;
  local_558 = in_RSI;
  local_550 = in_RDI;
  uStack_404 = in_stack_fffffffffffff93c;
  load_b_values(in_RDX,coeff_vals_02[0],in_RCX,coeff_vals_06[0],in_R8,(__m128i *)&local_5d8,
                in_stack_00000018,dequant_04,in_R9,(__m128i *)&local_5f8);
  load_coefficients(local_550);
  ptVar27 = local_550 + 8;
  local_608 = extraout_XMM0_Qa;
  uStack_600 = extraout_XMM0_Qb;
  alVar44 = load_coefficients(ptVar27);
  sign[0] = alVar44[1];
  local_378 = local_608;
  uStack_370 = uStack_600;
  local_37c = 0xf;
  auVar15._8_8_ = uStack_600;
  auVar15._0_8_ = local_608;
  local_628 = psraw(auVar15,ZEXT416(0xf));
  local_39c = 0xf;
  auVar14._8_8_ = extraout_XMM0_Qb_00;
  auVar14._0_8_ = extraout_XMM0_Qa_00;
  local_638 = psraw(auVar14,ZEXT416(0xf));
  alVar44[1] = (longlong)coeff_vals_02[0];
  alVar44[0] = (longlong)ptVar27;
  sign[1] = (longlong)coeff_vals_06[0];
  alVar44 = invert_sign_sse2(alVar44,sign);
  sign_00[0] = alVar44[1];
  a[1] = (longlong)coeff_vals_02[0];
  a[0] = (longlong)ptVar27;
  sign_00[1] = (longlong)coeff_vals_06[0];
  local_648 = extraout_XMM0_Qa_01;
  uStack_640 = extraout_XMM0_Qb_01;
  invert_sign_sse2(a,sign_00);
  local_658[1] = extraout_XMM0_Qb_02;
  local_658[0] = extraout_XMM0_Qa_02;
  update_mask0(qcoeff0_00,in_stack_fffffffffffff950,in_stack_fffffffffffff948,
               (int16_t *)CONCAT44(uVar49,uVar48),
               (int *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (__m128i *)CONCAT44(uVar47,iVar46));
  local_2f8 = local_648;
  uVar23 = local_2f8;
  uStack_2f0 = uStack_640;
  uVar24 = uStack_2f0;
  lStack_300 = uStack_5b0;
  local_2f8._0_2_ = (short)local_648;
  local_2f8._2_2_ = (short)(local_648 >> 0x10);
  local_2f8._4_2_ = (short)(local_648 >> 0x20);
  local_2f8._6_2_ = (short)(local_648 >> 0x30);
  uStack_2f0._0_2_ = (short)uStack_640;
  uStack_2f0._2_2_ = (short)(uStack_640 >> 0x10);
  uStack_2f0._4_2_ = (short)(uStack_640 >> 0x20);
  uStack_2f0._6_2_ = (short)(uStack_640 >> 0x30);
  local_668 = -(ushort)((short)local_5b8 < (short)local_2f8);
  sVar39 = (short)((uint)local_5b8 >> 0x10);
  sStack_666 = -(ushort)(sVar39 < local_2f8._2_2_);
  sStack_664 = -(ushort)((short)uStack_5b4 < local_2f8._4_2_);
  sVar40 = (short)((uint)uStack_5b4 >> 0x10);
  sStack_662 = -(ushort)(sVar40 < local_2f8._6_2_);
  sStack_660 = -(ushort)((short)uStack_5b0 < (short)uStack_2f0);
  sStack_65e = -(ushort)((short)((ulong)uStack_5b0 >> 0x10) < uStack_2f0._2_2_);
  sVar42 = (short)((ulong)uStack_5b0 >> 0x20);
  sStack_65c = -(ushort)(sVar42 < uStack_2f0._4_2_);
  sVar43 = (short)((ulong)uStack_5b0 >> 0x30);
  sStack_65a = -(ushort)(sVar43 < uStack_2f0._6_2_);
  uStack_40c = uStack_5b0._4_4_;
  _local_408 = CONCAT44(uStack_404,(undefined4)local_5a8);
  uStack_41c = uStack_5b0._4_4_;
  _local_418 = CONCAT44(uStack_5b4,(undefined4)local_5a8);
  auVar1._4_8_ = uStack_5b0;
  auVar1._0_4_ = uStack_5b4;
  auVar28._0_8_ = auVar1._0_8_ << 0x20;
  auVar28._8_4_ = uStack_420;
  auVar28._12_4_ = uStack_5b0._4_4_;
  uStack_5b0 = auVar28._8_8_;
  local_318 = local_658[0];
  lVar20 = local_318;
  uStack_310 = local_658[1];
  lVar21 = uStack_310;
  local_318._0_2_ = (short)local_658[0];
  local_318._2_2_ = local_658[0]._2_2_;
  local_318._4_2_ = local_658[0]._4_2_;
  local_318._6_2_ = local_658[0]._6_2_;
  uStack_310._0_2_ = (short)local_658[1];
  uStack_310._2_2_ = local_658[1]._2_2_;
  uStack_310._4_2_ = local_658[1]._4_2_;
  uStack_310._6_2_ = local_658[1]._6_2_;
  uStack_320._0_2_ = (short)uStack_420;
  uStack_320._2_2_ = (short)((uint)uStack_420 >> 0x10);
  local_678 = -(ushort)((short)local_5b8 < (short)local_318);
  sStack_676 = -(ushort)(sVar39 < local_318._2_2_);
  sStack_674 = -(ushort)((short)uStack_5b4 < local_318._4_2_);
  sStack_672 = -(ushort)(sVar40 < local_318._6_2_);
  sStack_670 = -(ushort)((short)uStack_320 < (short)uStack_310);
  sStack_66e = -(ushort)(uStack_320._2_2_ < uStack_310._2_2_);
  sStack_66c = -(ushort)(sVar42 < uStack_310._4_2_);
  sStack_66a = -(ushort)(sVar43 < uStack_310._6_2_);
  coeff_vals_06[0] = (__m128i *)&local_668;
  cmp_mask1_00 = (__m128i *)&local_678;
  piVar26 = &local_58c;
  coeff_vals_02[0] = (__m128i *)&stack0xfffffffffffff958;
  uStack_320 = uStack_5b0;
  local_318 = lVar20;
  uStack_310 = lVar21;
  local_2f8 = uVar23;
  uStack_2f0 = uVar24;
  update_mask1(coeff_vals_06[0],cmp_mask1_00,_abs_coeff,piVar26,coeff_vals_02[0]);
  local_2b8 = CONCAT26(sStack_662,CONCAT24(sStack_664,CONCAT22(sStack_666,local_668)));
  uStack_2b0 = CONCAT26(sStack_65a,CONCAT24(sStack_65c,CONCAT22(sStack_65e,sStack_660)));
  local_2c8 = CONCAT26(sStack_672,CONCAT24(sStack_674,CONCAT22(sStack_676,local_678)));
  uStack_2c0 = CONCAT26(sStack_66a,CONCAT24(sStack_66c,CONCAT22(sStack_66e,sStack_670)));
  local_298 = local_2b8 | local_2c8;
  uStack_290 = uStack_2b0 | uStack_2c0;
  auVar17._8_8_ = uStack_290;
  auVar17._0_8_ = local_298;
  if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar17 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar17 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar17 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar17 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar17 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar17 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar17 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uStack_290 >> 7 & 1) == 0) && (uStack_290 >> 0xf & 1) == 0) &&
          (uStack_290 >> 0x17 & 1) == 0) && (uStack_290 >> 0x1f & 1) == 0) &&
        (uStack_290 >> 0x27 & 1) == 0) && (uStack_290 >> 0x2f & 1) == 0) &&
      (uStack_290 >> 0x37 & 1) == 0) && -1 < (long)uStack_290) {
    local_a8 = local_5a8;
    uStack_a0 = uStack_5a0;
    *in_stack_00000008 = local_5a8;
    in_stack_00000008[1] = uStack_5a0;
    local_b0 = in_stack_00000008 + 2;
    local_c8 = local_5a8;
    uStack_c0 = uStack_5a0;
    *local_b0 = local_5a8;
    in_stack_00000008[3] = uStack_5a0;
    local_d0 = in_stack_00000008 + 4;
    local_e8 = local_5a8;
    uStack_e0 = uStack_5a0;
    *local_d0 = local_5a8;
    in_stack_00000008[5] = uStack_5a0;
    local_f0 = in_stack_00000008 + 6;
    local_108 = local_5a8;
    uStack_100 = uStack_5a0;
    *local_f0 = local_5a8;
    in_stack_00000008[7] = uStack_5a0;
    local_128 = local_5a8;
    uStack_120 = uStack_5a0;
    *in_stack_00000010 = local_5a8;
    in_stack_00000010[1] = uStack_5a0;
    local_130 = in_stack_00000010 + 2;
    local_148 = local_5a8;
    uStack_140 = uStack_5a0;
    *local_130 = local_5a8;
    in_stack_00000010[3] = uStack_5a0;
    local_150 = in_stack_00000010 + 4;
    local_168 = local_5a8;
    uStack_160 = uStack_5a0;
    *local_150 = local_5a8;
    in_stack_00000010[5] = uStack_5a0;
    local_170 = in_stack_00000010 + 6;
    local_188 = local_5a8;
    uStack_180 = uStack_5a0;
    *local_170 = local_5a8;
    in_stack_00000010[7] = uStack_5a0;
    uStack_42c = uStack_5c0._4_4_;
    uStack_43c = uStack_5c0._4_4_;
    auVar2._4_8_ = uStack_2b0;
    auVar2._0_4_ = local_5c8._4_4_;
    auVar29._0_8_ = auVar2._0_8_ << 0x20;
    auVar29._8_4_ = uStack_440;
    auVar29._12_4_ = uStack_5c0._4_4_;
    uStack_5c0 = auVar29._8_8_;
    uStack_44c = uStack_5d0._4_4_;
    uStack_45c = uStack_5d0._4_4_;
    auVar3._4_8_ = uStack_5c0;
    auVar3._0_4_ = uStack_5d4;
    auVar30._0_8_ = auVar3._0_8_ << 0x20;
    auVar30._8_4_ = uStack_460;
    auVar30._12_4_ = uStack_5d0._4_4_;
    uStack_5d0 = auVar30._8_8_;
    uStack_46c = uStack_5f0._4_4_;
    uStack_47c = uStack_5f0._4_4_;
    uStack_474 = (undefined4)((ulong)local_5f8 >> 0x20);
    _local_478 = CONCAT44(uStack_474,local_5e8);
    auVar4._4_8_ = uStack_5d0;
    auVar4._0_4_ = uStack_474;
    auVar31._0_8_ = auVar4._0_8_ << 0x20;
    auVar31._8_4_ = uStack_480;
    auVar31._12_4_ = uStack_5f0._4_4_;
    uStack_5f0 = auVar31._8_8_;
    local_4a8 = CONCAT44(uStack_5e4,local_5e8);
    uStack_48c = uStack_5e0._4_4_;
    _local_488 = CONCAT44(uStack_474,local_5d8);
    uStack_49c = uStack_5e0._4_4_;
    auVar5._4_8_ = uStack_5f0;
    auVar5._0_4_ = uStack_5e4;
    auVar32._0_8_ = auVar5._0_8_ << 0x20;
    auVar32._8_4_ = uStack_4a0;
    auVar32._12_4_ = uStack_5e0._4_4_;
    uStack_5e0 = auVar32._8_8_;
  }
  else {
    auVar6._4_8_ = uStack_2b0;
    auVar6._0_4_ = uStack_5d4;
    auVar33._0_8_ = auVar6._0_8_ << 0x20;
    auVar33._8_4_ = (undefined4)uStack_5d0;
    auVar33._12_4_ = uStack_5d0._4_4_;
    uVar41 = auVar33._8_8_;
    shift_00[1] = (longlong)dequant_04;
    shift_00[0] = (longlong)piVar45;
    quant_00[1] = (longlong)coeff_vals_02[0];
    quant_00[0] = (longlong)piVar26;
    round_00[1] = extraout_RDX;
    round_00[0] = (longlong)cmp_mask1_00;
    calculate_qcoeff((__m128i *)&local_648,round_00,quant_00,shift_00);
    uStack_4ac = uStack_5c0._4_4_;
    local_4a8 = CONCAT44(local_4a8._4_4_,local_5b8);
    uStack_4bc = uStack_5c0._4_4_;
    auVar7._4_8_ = uVar41;
    auVar7._0_4_ = local_5c8._4_4_;
    auVar34._0_8_ = auVar7._0_8_ << 0x20;
    auVar34._8_4_ = uStack_4c0;
    auVar34._12_4_ = uStack_5c0._4_4_;
    uStack_5c0 = auVar34._8_8_;
    uStack_4cc = uStack_5d0._4_4_;
    uStack_4dc = uStack_5d0._4_4_;
    auVar8._4_8_ = uStack_5c0;
    auVar8._0_4_ = uStack_5d4;
    auVar35._0_8_ = auVar8._0_8_ << 0x20;
    auVar35._8_4_ = uStack_4e0;
    auVar35._12_4_ = uStack_5d0._4_4_;
    uStack_5d0 = auVar35._8_8_;
    uStack_4ec = uStack_5f0._4_4_;
    local_508 = local_5f8;
    uStack_4fc = uStack_5f0._4_4_;
    uStack_4f4 = (undefined4)((ulong)local_5f8 >> 0x20);
    _local_4f8 = CONCAT44(uStack_4f4,local_5e8);
    auVar9._4_8_ = uStack_5d0;
    auVar9._0_4_ = uStack_4f4;
    auVar36._0_8_ = auVar9._0_8_ << 0x20;
    auVar36._8_4_ = uStack_500;
    auVar36._12_4_ = uStack_5f0._4_4_;
    uStack_5f0 = auVar36._8_8_;
    coeff_vals_06[0] = &local_658;
    shift_01[1] = (longlong)dequant_04;
    shift_01[0] = (longlong)piVar45;
    quant_01[1] = (longlong)coeff_vals_02[0];
    quant_01[0] = (longlong)piVar26;
    round_01[1] = extraout_RDX_00;
    round_01[0] = (longlong)cmp_mask1_00;
    calculate_qcoeff(coeff_vals_06[0],round_01,quant_01,shift_01);
    a_00[1] = (longlong)cmp_mask1_00;
    a_00[0] = (longlong)coeff_vals_06[0];
    sign_01[1] = (longlong)piVar26;
    sign_01[0] = extraout_RDX_01;
    alVar44 = invert_sign_sse2(a_00,sign_01);
    sign_02[0] = alVar44[1];
    a_01[1] = (longlong)cmp_mask1_00;
    a_01[0] = (longlong)coeff_vals_06[0];
    sign_02[1] = (longlong)piVar26;
    local_648 = extraout_XMM0_Qa_03;
    uStack_640 = extraout_XMM0_Qb_03;
    alVar44 = invert_sign_sse2(a_01,sign_02);
    local_28 = CONCAT26(sStack_662,CONCAT24(sStack_664,CONCAT22(sStack_666,local_668)));
    uStack_20 = CONCAT26(sStack_65a,CONCAT24(sStack_65c,CONCAT22(sStack_65e,sStack_660)));
    local_18 = local_648;
    uStack_10 = uStack_640;
    local_648 = local_648 & local_28;
    uStack_640 = uStack_640 & uStack_20;
    local_48 = CONCAT26(sStack_672,CONCAT24(sStack_674,CONCAT22(sStack_676,local_678)));
    uStack_40 = CONCAT26(sStack_66a,CONCAT24(sStack_66c,CONCAT22(sStack_66e,sStack_670)));
    auVar19._8_8_ = extraout_XMM0_Qb_04;
    auVar19._0_8_ = extraout_XMM0_Qa_04;
    auVar18._8_8_ = uStack_40;
    auVar18._0_8_ = local_48;
    local_658 = (__m128i)(auVar19 & auVar18);
    coeff_vals[1] = (longlong)cmp_mask1_00;
    coeff_vals[0] = (longlong)in_stack_00000008;
    uVar41 = uStack_40;
    store_coefficients(coeff_vals,alVar44[1]);
    coeff_vals_00[0] = in_stack_00000008 + 4;
    coeff_vals_00[1] = (longlong)cmp_mask1_00;
    store_coefficients(coeff_vals_00,coeff_ptr_00);
    auVar10._4_8_ = uVar41;
    auVar10._0_4_ = uStack_5e4;
    auVar37._0_8_ = auVar10._0_8_ << 0x20;
    auVar37._8_4_ = (undefined4)uStack_5e0;
    auVar37._12_4_ = uStack_5e0._4_4_;
    uVar41 = auVar37._8_8_;
    qcoeff_00[1] = (longlong)cmp_mask1_00;
    qcoeff_00[0] = (longlong)coeff_vals_00[0];
    dequant_00[1] = (longlong)piVar26;
    dequant_00[0] = extraout_RDX_02;
    alVar44 = calculate_dqcoeff(qcoeff_00,dequant_00);
    dequant_01[0] = alVar44[1];
    uStack_50c = uStack_5e0._4_4_;
    local_508 = CONCAT44(local_508._4_4_,local_5d8);
    uStack_51c = uStack_5e0._4_4_;
    auVar11._4_8_ = uVar41;
    auVar11._0_4_ = uStack_5e4;
    auVar38._0_8_ = auVar11._0_8_ << 0x20;
    auVar38._8_4_ = uStack_520;
    auVar38._12_4_ = uStack_5e0._4_4_;
    uStack_5e0 = auVar38._8_8_;
    qcoeff_01[1] = (longlong)cmp_mask1_00;
    qcoeff_01[0] = (longlong)coeff_vals_00[0];
    dequant_01[1] = (longlong)piVar26;
    alVar44 = calculate_dqcoeff(qcoeff_01,dequant_01);
    coeff_vals_01[1] = (longlong)cmp_mask1_00;
    coeff_vals_01[0] = (longlong)in_stack_00000010;
    store_coefficients(coeff_vals_01,alVar44[1]);
    coeff_vals_02[0] = (__m128i *)(in_stack_00000010 + 4);
    coeff_vals_02[1] = (longlong)cmp_mask1_00;
    store_coefficients(coeff_vals_02,coeff_ptr_01);
    coeff_vals_06[0] = coeff_vals_02[0];
  }
  while (local_57c < local_558) {
    load_coefficients(local_550 + local_57c);
    coeff_vals_04[0] = (long)local_57c;
    ptVar27 = local_550 + coeff_vals_04[0] + 8;
    local_608 = extraout_XMM0_Qa_05;
    uStack_600 = extraout_XMM0_Qb_05;
    alVar44 = load_coefficients(ptVar27);
    sign_03[0] = alVar44[1];
    local_3b8 = local_608;
    uStack_3b0 = uStack_600;
    local_3bc = 0xf;
    auVar13._8_8_ = uStack_600;
    auVar13._0_8_ = local_608;
    local_628 = psraw(auVar13,ZEXT416(0xf));
    local_3dc = 0xf;
    auVar12._8_8_ = extraout_XMM0_Qb_06;
    auVar12._0_8_ = extraout_XMM0_Qa_06;
    local_638 = psraw(auVar12,ZEXT416(0xf));
    a_02[1] = (longlong)cmp_mask1_00;
    a_02[0] = (longlong)ptVar27;
    sign_03[1] = coeff_vals_04[0];
    alVar44 = invert_sign_sse2(a_02,sign_03);
    sign_04[0] = alVar44[1];
    a_03[1] = (longlong)cmp_mask1_00;
    a_03[0] = (longlong)ptVar27;
    sign_04[1] = coeff_vals_04[0];
    local_648 = extraout_XMM0_Qa_07;
    uStack_640 = extraout_XMM0_Qb_07;
    invert_sign_sse2(a_03,sign_04);
    local_658[1] = extraout_XMM0_Qb_08;
    local_658[0] = extraout_XMM0_Qa_08;
    update_mask0(qcoeff0_00,in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                 (int16_t *)CONCAT44(uVar49,uVar48),
                 (int *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                 (__m128i *)CONCAT44(uVar47,iVar46));
    local_338 = local_648;
    uVar23 = local_338;
    uStack_330 = uStack_640;
    uVar24 = uStack_330;
    uStack_340 = uStack_5b0;
    lVar22 = uStack_340;
    local_338._0_2_ = (short)local_648;
    local_338._2_2_ = (short)(local_648 >> 0x10);
    local_338._4_2_ = (short)(local_648 >> 0x20);
    local_338._6_2_ = (short)(local_648 >> 0x30);
    uStack_330._0_2_ = (short)uStack_640;
    uStack_330._2_2_ = (short)(uStack_640 >> 0x10);
    uStack_330._4_2_ = (short)(uStack_640 >> 0x20);
    uStack_330._6_2_ = (short)(uStack_640 >> 0x30);
    local_348 = (short)local_5b8;
    sStack_346 = (short)((uint)local_5b8 >> 0x10);
    sStack_344 = (short)uStack_5b4;
    sStack_342 = (short)((uint)uStack_5b4 >> 0x10);
    uStack_340._0_2_ = (short)uStack_5b0;
    uStack_340._2_2_ = (short)((ulong)uStack_5b0 >> 0x10);
    uStack_340._4_2_ = (short)((ulong)uStack_5b0 >> 0x20);
    uStack_340._6_2_ = (short)((ulong)uStack_5b0 >> 0x30);
    local_668 = -(ushort)(local_348 < (short)local_338);
    sStack_666 = -(ushort)(sStack_346 < local_338._2_2_);
    sStack_664 = -(ushort)(sStack_344 < local_338._4_2_);
    sStack_662 = -(ushort)(sStack_342 < local_338._6_2_);
    sStack_660 = -(ushort)((short)uStack_340 < (short)uStack_330);
    sStack_65e = -(ushort)(uStack_340._2_2_ < uStack_330._2_2_);
    sStack_65c = -(ushort)(uStack_340._4_2_ < uStack_330._4_2_);
    sStack_65a = -(ushort)(uStack_340._6_2_ < uStack_330._6_2_);
    local_358 = local_658[0];
    lVar20 = local_358;
    uStack_350 = local_658[1];
    lVar21 = uStack_350;
    lStack_360 = uStack_5b0;
    local_358._0_2_ = (short)local_658[0];
    local_358._2_2_ = local_658[0]._2_2_;
    local_358._4_2_ = local_658[0]._4_2_;
    local_358._6_2_ = local_658[0]._6_2_;
    uStack_350._0_2_ = (short)local_658[1];
    uStack_350._2_2_ = local_658[1]._2_2_;
    uStack_350._4_2_ = local_658[1]._4_2_;
    uStack_350._6_2_ = local_658[1]._6_2_;
    local_678 = -(ushort)(local_348 < (short)local_358);
    sStack_676 = -(ushort)(sStack_346 < local_358._2_2_);
    sStack_674 = -(ushort)(sStack_344 < local_358._4_2_);
    sStack_672 = -(ushort)(sStack_342 < local_358._6_2_);
    sStack_670 = -(ushort)((short)uStack_340 < (short)uStack_350);
    sStack_66e = -(ushort)(uStack_340._2_2_ < uStack_350._2_2_);
    sStack_66c = -(ushort)(uStack_340._4_2_ < uStack_350._4_2_);
    sStack_66a = -(ushort)(uStack_340._6_2_ < uStack_350._6_2_);
    coeff_vals_06[0] = (__m128i *)&local_668;
    cmp_mask1_00 = (__m128i *)&local_678;
    piVar26 = &local_58c;
    coeff_vals_02[0] = (__m128i *)&stack0xfffffffffffff958;
    local_358 = lVar20;
    uStack_350 = lVar21;
    uStack_340 = lVar22;
    local_338 = uVar23;
    uStack_330 = uVar24;
    update_mask1(coeff_vals_06[0],cmp_mask1_00,_abs_coeff + local_57c,piVar26,coeff_vals_02[0]);
    local_2d8 = CONCAT26(sStack_662,CONCAT24(sStack_664,CONCAT22(sStack_666,local_668)));
    uStack_2d0 = CONCAT26(sStack_65a,CONCAT24(sStack_65c,CONCAT22(sStack_65e,sStack_660)));
    local_2e8 = CONCAT26(sStack_672,CONCAT24(sStack_674,CONCAT22(sStack_676,local_678)));
    uStack_2e0 = CONCAT26(sStack_66a,CONCAT24(sStack_66c,CONCAT22(sStack_66e,sStack_670)));
    local_2a8 = local_2d8 | local_2e8;
    uStack_2a0 = uStack_2d0 | uStack_2e0;
    auVar16._8_8_ = uStack_2a0;
    auVar16._0_8_ = local_2a8;
    if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar16 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar16 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar16 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar16 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar16 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uStack_2a0 >> 7 & 1) == 0) && (uStack_2a0 >> 0xf & 1) == 0) &&
            (uStack_2a0 >> 0x17 & 1) == 0) && (uStack_2a0 >> 0x1f & 1) == 0) &&
          (uStack_2a0 >> 0x27 & 1) == 0) && (uStack_2a0 >> 0x2f & 1) == 0) &&
        (uStack_2a0 >> 0x37 & 1) == 0) && -1 < (long)uStack_2a0) {
      local_190 = (undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4);
      local_1a8 = local_5a8;
      uStack_1a0 = uStack_5a0;
      *local_190 = local_5a8;
      local_190[1] = uStack_5a0;
      local_1b0 = (undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4 + 0x10);
      local_1c8 = local_5a8;
      uStack_1c0 = uStack_5a0;
      *local_1b0 = local_5a8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4 + 0x18) = uStack_5a0;
      local_1d0 = (undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4 + 0x20);
      local_1e8 = local_5a8;
      uStack_1e0 = uStack_5a0;
      *local_1d0 = local_5a8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4 + 0x28) = uStack_5a0;
      local_1f0 = (undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4 + 0x30);
      local_208 = local_5a8;
      uStack_200 = uStack_5a0;
      *local_1f0 = local_5a8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_57c * 4 + 0x38) = uStack_5a0;
      local_210 = (undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4);
      local_228 = local_5a8;
      uStack_220 = uStack_5a0;
      *local_210 = local_5a8;
      local_210[1] = uStack_5a0;
      local_230 = (undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x10);
      local_248 = local_5a8;
      uStack_240 = uStack_5a0;
      *local_230 = local_5a8;
      *(undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x18) = uStack_5a0;
      local_250 = (undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x20);
      local_268 = local_5a8;
      uStack_260 = uStack_5a0;
      *local_250 = local_5a8;
      *(undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x28) = uStack_5a0;
      local_270 = (undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x30);
      local_288 = local_5a8;
      uStack_280 = uStack_5a0;
      *local_270 = local_5a8;
      *(undefined8 *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x38) = uStack_5a0;
      local_57c = local_57c + 0x10;
    }
    else {
      shift_02[1] = (longlong)dequant_04;
      shift_02[0] = (longlong)piVar45;
      quant_02[1] = (longlong)coeff_vals_02[0];
      quant_02[0] = (longlong)piVar26;
      round_02[1] = extraout_RDX_03;
      round_02[0] = (longlong)cmp_mask1_00;
      calculate_qcoeff((__m128i *)&local_648,round_02,quant_02,shift_02);
      coeff_vals_06[0] = &local_658;
      shift_03[1] = (longlong)dequant_04;
      shift_03[0] = (longlong)piVar45;
      quant_03[1] = (longlong)coeff_vals_02[0];
      quant_03[0] = (longlong)piVar26;
      round_03[1] = extraout_RDX_04;
      round_03[0] = (longlong)cmp_mask1_00;
      calculate_qcoeff(coeff_vals_06[0],round_03,quant_03,shift_03);
      a_04[1] = (longlong)cmp_mask1_00;
      a_04[0] = (longlong)coeff_vals_06[0];
      sign_05[1] = (longlong)piVar26;
      sign_05[0] = extraout_RDX_05;
      alVar44 = invert_sign_sse2(a_04,sign_05);
      sign_06[0] = alVar44[1];
      a_05[1] = (longlong)cmp_mask1_00;
      a_05[0] = (longlong)coeff_vals_06[0];
      sign_06[1] = (longlong)piVar26;
      local_648 = extraout_XMM0_Qa_09;
      uStack_640 = extraout_XMM0_Qb_09;
      alVar44 = invert_sign_sse2(a_05,sign_06);
      local_68 = CONCAT26(sStack_662,CONCAT24(sStack_664,CONCAT22(sStack_666,local_668)));
      uStack_60 = CONCAT26(sStack_65a,CONCAT24(sStack_65c,CONCAT22(sStack_65e,sStack_660)));
      local_58 = local_648;
      uStack_50 = uStack_640;
      local_648 = local_648 & local_68;
      uStack_640 = uStack_640 & uStack_60;
      local_88 = CONCAT26(sStack_672,CONCAT24(sStack_674,CONCAT22(sStack_676,local_678)));
      uStack_80 = CONCAT26(sStack_66a,CONCAT24(sStack_66c,CONCAT22(sStack_66e,sStack_670)));
      local_658[1] = extraout_XMM0_Qb_10 & uStack_80;
      local_658[0] = extraout_XMM0_Qa_10 & local_88;
      coeff_vals_03[0] = (long)in_stack_00000008 + (long)local_57c * 4;
      coeff_vals_03[1] = (longlong)cmp_mask1_00;
      store_coefficients(coeff_vals_03,alVar44[1]);
      coeff_vals_04[0] = (long)in_stack_00000008 + (long)local_57c * 4 + 0x20;
      coeff_vals_04[1] = (longlong)cmp_mask1_00;
      store_coefficients(coeff_vals_04,coeff_ptr_02);
      qcoeff_02[1] = (longlong)cmp_mask1_00;
      qcoeff_02[0] = coeff_vals_04[0];
      dequant_02[1] = (longlong)piVar26;
      dequant_02[0] = extraout_RDX_06;
      alVar44 = calculate_dqcoeff(qcoeff_02,dequant_02);
      dequant_03[0] = alVar44[1];
      qcoeff_03[1] = (longlong)cmp_mask1_00;
      qcoeff_03[0] = coeff_vals_04[0];
      dequant_03[1] = (longlong)piVar26;
      alVar44 = calculate_dqcoeff(qcoeff_03,dequant_03);
      coeff_vals_05[0] = (long)in_stack_00000010 + (long)local_57c * 4;
      coeff_vals_05[1] = (longlong)cmp_mask1_00;
      store_coefficients(coeff_vals_05,alVar44[1]);
      coeff_vals_06[0] = (__m128i *)((long)in_stack_00000010 + (long)local_57c * 4 + 0x20);
      coeff_vals_06[1] = (longlong)cmp_mask1_00;
      store_coefficients(coeff_vals_06,coeff_ptr_03);
      local_57c = local_57c + 0x10;
    }
  }
  if (local_588 != 0) {
    mask[1] = (longlong)cmp_mask1_00;
    mask[0] = (longlong)coeff_vals_06[0];
    local_580 = calculate_non_zero_count(mask);
  }
  if (local_58c != 0) {
    mask_00[1] = (longlong)cmp_mask1_00;
    mask_00[0] = (longlong)coeff_vals_06[0];
    local_584 = calculate_non_zero_count(mask_00);
  }
  while (local_700 = local_584 + -1, local_708 = local_580, local_580 <= local_700) {
    iVar46 = (int)*(short *)(_prescan_add_val + (long)local_700 * 2);
    *(undefined4 *)((long)in_stack_00000008 + (long)iVar46 * 4) = 0;
    *(undefined4 *)((long)in_stack_00000010 + (long)iVar46 * 4) = 0;
    local_584 = local_700;
  }
  do {
    local_708 = local_708 + -1;
    if (local_708 < 0) goto LAB_0049b263;
  } while (*(int *)((long)in_stack_00000008 +
                   (long)(int)*(short *)(_prescan_add_val + (long)local_708 * 2) * 4) == 0);
  local_590._0_2_ = (short)local_708;
LAB_0049b263:
  *in_stack_00000020 = (short)local_590 + 1;
  local_710 = 0;
  do {
    if (local_580 <= local_710) {
LAB_0049b2d9:
      if (((-1 < (int)(*in_stack_00000020 - 1)) && (local_6fc == *in_stack_00000020 - 1)) &&
         ((iVar46 = (int)*(short *)(_prescan_add_val + (long)(int)(*in_stack_00000020 - 1) * 2),
          *(int *)((long)in_stack_00000008 + (long)iVar46 * 4) == 1 ||
          (*(int *)((long)in_stack_00000008 + (long)iVar46 * 4) == -1)))) {
        uVar25 = 0;
        if (local_550[iVar46] << 5 < 0) {
          uVar25 = 0xffffffff;
        }
        if ((int)((local_550[iVar46] << 5 ^ uVar25) - uVar25) <
            local_560[(int)(uint)(iVar46 != 0)] * 0x20 +
            (in_stack_00000018[(int)(uint)(iVar46 != 0)] * 0x20d + 0x40 >> 7)) {
          *(undefined4 *)((long)in_stack_00000008 + (long)iVar46 * 4) = 0;
          *(undefined4 *)((long)in_stack_00000010 + (long)iVar46 * 4) = 0;
          *in_stack_00000020 = 0;
        }
      }
      return;
    }
    if (*(int *)((long)in_stack_00000008 +
                (long)(int)*(short *)(_prescan_add_val + (long)local_710 * 2) * 4) != 0) {
      local_6fc = local_710;
      goto LAB_0049b2d9;
    }
    local_710 = local_710 + 1;
  } while( true );
}

Assistant:

void aom_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  // Poor man's abs().
  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff(&qcoeff0, round, quant, shift);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);

    calculate_qcoeff(&qcoeff1, round, quant, shift);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr);
    store_coefficients(coeff1, dqcoeff_ptr + 8);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr + index);
    store_coefficients(coeff1, dqcoeff_ptr + index + 8);

    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}